

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O2

void __thiscall
wasm::LLVMNonTrappingFPToIntLowering::run(LLVMNonTrappingFPToIntLowering *this,Module *module)

{
  undefined1 local_110 [8];
  PassRunner runner;
  undefined8 local_18;
  
  if (((module->features).features & 4) != 0) {
    PassRunner::PassRunner((PassRunner *)local_110,module);
    std::make_unique<wasm::LLVMNonTrappingFPToIntLoweringImpl>();
    runner._232_8_ = local_18;
    PassRunner::add((PassRunner *)local_110,
                    (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&runner.isNested);
    if (runner._232_8_ != 0) {
      (**(code **)(*(long *)runner._232_8_ + 8))();
    }
    runner.isNested = false;
    runner.addedPassesRemovedDWARF = false;
    runner._234_6_ = 0;
    runner.options.passesToSkip._M_h._M_single_bucket._0_1_ = 1;
    PassRunner::run((PassRunner *)local_110);
    *(byte *)&(module->features).features = (byte)(module->features).features & 0xfb;
    PassRunner::~PassRunner((PassRunner *)local_110);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasTruncSat()) {
      return;
    }
    PassRunner runner(module);
    // Run the Impl pass as an inner pass in parallel. This pass updates the
    // module features, so it can't be parallel.
    runner.add(std::make_unique<LLVMNonTrappingFPToIntLoweringImpl>());
    runner.setIsNested(true);
    runner.run();
    module->features.disable(FeatureSet::TruncSat);
  }